

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O2

void __thiscall fizplex::Base::swap_columns(Base *this,size_t i,size_t j)

{
  pointer pEVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  
  if ((i < this->m) && (j < this->m)) {
    pEVar1 = (this->etms).
             super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::swap<fizplex::Base::ETM>(pEVar1 + i,pEVar1 + j);
    pEVar1 = (this->etms).
             super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
             super__Vector_impl_data._M_start;
    pEVar1[i].col = i;
    pEVar1[j].col = j;
    puVar2 = (this->row_ordering)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    uVar3 = puVar2[i];
    puVar2[i] = puVar2[j];
    puVar2[j] = uVar3;
    return;
  }
  __assert_fail("i < m && j < m",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base.cc"
                ,0x1c,"void fizplex::Base::swap_columns(size_t, size_t)");
}

Assistant:

void Base::swap_columns(size_t i, size_t j) {
  assert(i < m && j < m);
  std::swap(etms[i], etms[j]);
  etms[i].col = i;
  etms[j].col = j;
  std::swap<size_t>(row_ordering[i], row_ordering[j]);
}